

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_clone.c
# Opt level: O0

_glist * clone_makeone(t_symbol *s,int argc,t_atom *argv)

{
  _glist *retval;
  t_atom *argv_local;
  int argc_local;
  t_symbol *s_local;
  
  pd_maininstance.pd_newest = (t_pd *)0x0;
  pd_typedmess(&pd_objectmaker,s,argc,argv);
  s_local = (t_symbol *)pd_maininstance.pd_newest;
  if (pd_maininstance.pd_newest == (t_pd *)0x0) {
    pd_error((void *)0x0,"clone: can\'t create subpatch \'%s\'",s->s_name);
    s_local = (t_symbol *)0x0;
  }
  else if (*pd_maininstance.pd_newest == canvas_class) {
    pd_maininstance.pd_newest = (t_pd *)0x0;
    *(ushort *)((long)s_local + 0xe8) = *(ushort *)((long)s_local + 0xe8) & 0xf7ff | 0x800;
  }
  else {
    pd_error((void *)0x0,"clone: can\'t clone \'%s\' because it\'s not an abstraction",s->s_name);
    pd_free(pd_maininstance.pd_newest);
    pd_maininstance.pd_newest = (t_pd *)0x0;
    s_local = (t_symbol *)0x0;
  }
  return (_glist *)s_local;
}

Assistant:

static t_canvas *clone_makeone(t_symbol *s, int argc, t_atom *argv)
{
    t_canvas *retval;
    pd_this->pd_newest = 0;
    typedmess(&pd_objectmaker, s, argc, argv);
    if (pd_this->pd_newest == 0)
    {
        pd_error(0, "clone: can't create subpatch '%s'",
            s->s_name);
        return (0);
    }
    if (*pd_this->pd_newest != canvas_class)
    {
        pd_error(0, "clone: can't clone '%s' because it's not an abstraction",
            s->s_name);
        pd_free(pd_this->pd_newest);
        pd_this->pd_newest = 0;
        return (0);
    }
    retval = (t_canvas *)pd_this->pd_newest;
    pd_this->pd_newest = 0;
    retval->gl_isclone = 1;
    return (retval);
}